

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_interp.c
# Opt level: O1

REF_STATUS ref_interp_create_search(REF_INTERP ref_interp)

{
  REF_CELL pRVar1;
  uint uVar2;
  REF_STATUS RVar3;
  undefined8 uVar4;
  int iVar5;
  REF_SEARCH ref_search;
  REF_DBL radius;
  REF_DBL center [3];
  REF_INT nodes [27];
  REF_SEARCH local_e0;
  double local_d8;
  REF_NODE local_d0;
  REF_DBL local_c8 [4];
  REF_INT local_a8 [30];
  
  local_d0 = ref_interp->from_grid->node;
  if (ref_interp->from_grid->twod == 0) {
    pRVar1 = ref_interp->from_tet;
    uVar2 = ref_search_create(&local_e0,pRVar1->n);
    if (uVar2 == 0) {
      if (0 < pRVar1->max) {
        iVar5 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar5,local_a8);
          if (RVar3 == 0) {
            uVar2 = ref_node_bounding_sphere(local_d0,local_a8,4,local_c8,&local_d8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x87,"ref_interp_create_search",(ulong)uVar2,"b");
              return uVar2;
            }
            uVar2 = ref_search_insert(local_e0,iVar5,local_c8,
                                      ref_interp->search_donor_scale * local_d8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x8a,"ref_interp_create_search",(ulong)uVar2,"ins");
              return uVar2;
            }
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < pRVar1->max);
      }
      goto LAB_001289c2;
    }
    uVar4 = 0x85;
  }
  else {
    pRVar1 = ref_interp->from_tri;
    uVar2 = ref_search_create(&local_e0,pRVar1->n);
    if (uVar2 == 0) {
      if (0 < pRVar1->max) {
        iVar5 = 0;
        do {
          RVar3 = ref_cell_nodes(pRVar1,iVar5,local_a8);
          if (RVar3 == 0) {
            uVar2 = ref_node_bounding_sphere(local_d0,local_a8,3,local_c8,&local_d8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x7f,"ref_interp_create_search",(ulong)uVar2,"b");
              return uVar2;
            }
            uVar2 = ref_search_insert(local_e0,iVar5,local_c8,
                                      ref_interp->search_donor_scale * local_d8);
            if (uVar2 != 0) {
              printf("%s: %d: %s: %d %s\n",
                     "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c"
                     ,0x82,"ref_interp_create_search",(ulong)uVar2,"ins");
              return uVar2;
            }
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 < pRVar1->max);
      }
LAB_001289c2:
      ref_interp->ref_search = local_e0;
      return 0;
    }
    uVar4 = 0x7d;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_interp.c",uVar4,
         "ref_interp_create_search",(ulong)uVar2,"create search");
  return uVar2;
}

Assistant:

REF_FCN static REF_STATUS ref_interp_create_search(REF_INTERP ref_interp) {
  REF_GRID from_grid = ref_interp_from_grid(ref_interp);
  REF_NODE from_node = ref_grid_node(from_grid);
  REF_CELL from_tet = ref_interp_from_tet(ref_interp);
  REF_CELL from_tri = ref_interp_from_tri(ref_interp);
  REF_INT cell, nodes[REF_CELL_MAX_SIZE_PER];
  REF_DBL center[3], radius;
  REF_SEARCH ref_search;

  if (ref_grid_twod(from_grid)) {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tri)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tri, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 3, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  } else {
    RSS(ref_search_create(&ref_search, ref_cell_n(from_tet)), "create search");
    each_ref_cell_valid_cell_with_nodes(from_tet, cell, nodes) {
      RSS(ref_node_bounding_sphere(from_node, nodes, 4, center, &radius), "b");
      RSS(ref_search_insert(ref_search, cell, center,
                            ref_interp_search_donor_scale(ref_interp) * radius),
          "ins");
    }
  }
  ref_interp_search(ref_interp) = ref_search;

  return REF_SUCCESS;
}